

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O2

tnt_stream * tnt_buf(tnt_stream *s)

{
  tnt_stream *s_00;
  undefined8 *puVar1;
  
  s_00 = tnt_stream_init(s);
  if (s_00 != (tnt_stream *)0x0) {
    puVar1 = (undefined8 *)tnt_mem_alloc(0x40);
    s_00->data = puVar1;
    if (puVar1 != (undefined8 *)0x0) {
      s_00->read = tnt_buf_read;
      s_00->read_reply = tnt_buf_reply;
      s_00->write = tnt_buf_write;
      s_00->writev = tnt_buf_writev;
      s_00->free = tnt_buf_free;
      puVar1[2] = 0;
      puVar1[3] = 0;
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[4] = tnt_buf_resize;
      puVar1[5] = 0;
      puVar1[6] = 0;
      *(undefined4 *)(puVar1 + 7) = 0;
      return s_00;
    }
    if (s == (tnt_stream *)0x0) {
      tnt_stream_free(s_00);
    }
  }
  return (tnt_stream *)0x0;
}

Assistant:

struct tnt_stream *tnt_buf(struct tnt_stream *s) {
	int allocated = s == NULL;
	s = tnt_stream_init(s);
	if (s == NULL)
		return NULL;
	/* allocating stream data */
	s->data = tnt_mem_alloc(sizeof(struct tnt_stream_buf));
	if (s->data == NULL) {
		if (allocated)
			tnt_stream_free(s);
		return NULL;
	}
	/* initializing interfaces */
	s->read       = tnt_buf_read;
	s->read_reply = tnt_buf_reply;
	s->write      = tnt_buf_write;
	s->writev     = tnt_buf_writev;
	s->free       = tnt_buf_free;
	/* initializing internal data */
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	sb->rdoff   = 0;
	sb->size    = 0;
	sb->alloc   = 0;
	sb->data    = NULL;
	sb->resize  = tnt_buf_resize;
	sb->free    = NULL;
	sb->subdata = NULL;
	sb->as      = 0;
	return s;
}